

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O3

C_Type * enum_specifier(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  _Bool _Var1;
  C_Type *pCVar2;
  char *pcVar3;
  C_Node *node;
  int64_t iVar4;
  void *val;
  int iVar5;
  C_Scope *pCVar6;
  int iVar7;
  C_Token *tok_00;
  bool bVar8;
  C_Token *local_50;
  C_TokenKind local_44;
  C_Token **local_40;
  C_Token *local_38;
  
  local_40 = rest;
  pCVar2 = C_enum_type(parser);
  local_44 = tok->kind;
  if (local_44 == TK_IDENT) {
    tok_00 = tok->next;
    _Var1 = C_equal(tok_00,"{");
    local_38 = tok;
    if (!_Var1) {
      pCVar6 = (C_Scope *)&parser->scope;
      do {
        pCVar6 = pCVar6->next;
        if (pCVar6 == (C_Scope *)0x0) {
          pcVar3 = "unknown enum type";
          goto LAB_0012d0bb;
        }
        pCVar2 = (C_Type *)hashmap_get2(&pCVar6->tags,tok->loc,tok->len);
      } while (pCVar2 == (C_Type *)0x0);
      if (pCVar2->kind == TY_ENUM) {
        *local_40 = tok_00;
        return pCVar2;
      }
      pcVar3 = "not an enum tag";
LAB_0012d0bb:
      C_error_tok(parser,tok,pcVar3);
    }
  }
  else {
    local_38 = (C_Token *)0x0;
    tok_00 = tok;
  }
  local_50 = C_skip(parser,tok_00,"{");
  _Var1 = consume_end(local_40,local_50);
  if (!_Var1) {
    iVar5 = 0;
    iVar7 = 0;
    do {
      bVar8 = iVar5 != 0;
      iVar5 = iVar5 + -1;
      if (bVar8) {
        local_50 = C_skip(parser,local_50,",");
      }
      pcVar3 = get_ident(parser,local_50);
      local_50 = local_50->next;
      _Var1 = C_equal(local_50,"=");
      if (_Var1) {
        node = conditional(parser,&local_50,local_50->next);
        iVar4 = eval2(parser,node,(char ***)0x0);
        iVar7 = (int)iVar4;
      }
      val = (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x20);
      hashmap_put(&parser->scope->vars,pcVar3,val);
      *(C_Type **)((long)val + 0x10) = pCVar2;
      *(int *)((long)val + 0x18) = iVar7;
      iVar7 = iVar7 + 1;
      _Var1 = consume_end(local_40,local_50);
    } while (!_Var1);
  }
  if (local_44 == TK_IDENT) {
    hashmap_put2(&parser->scope->tags,local_38->loc,local_38->len,pCVar2);
  }
  return pCVar2;
}

Assistant:

static C_Type *enum_specifier(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Type *ty = C_enum_type(parser);

  // Read a struct tag.
  C_Token *tag = NULL;
  if (tok->kind == TK_IDENT) {
    tag = tok;
    tok = tok->next;
  }

  if (tag && !C_equal(tok, "{")) {
    C_Type *ty = find_tag(parser, tag);
    if (!ty)
      C_error_tok(parser, tag, "unknown enum type");
    if (ty->kind != TY_ENUM)
      C_error_tok(parser, tag, "not an enum tag");
    *rest = tok;
    return ty;
  }

  tok = C_skip(parser, tok, "{");

  // Read an enum-list.
  int i = 0;
  int val = 0;
  while (!consume_end(rest, tok)) {
    if (i++ > 0)
      tok = C_skip(parser, tok, ",");

    char *name = get_ident(parser, tok);
    tok = tok->next;

    if (C_equal(tok, "="))
      val = C_const_expr(parser, &tok, tok->next);

    C_VarScope *sc = push_scope(parser, name);
    sc->enum_ty = ty;
    sc->enum_val = val++;
  }

  if (tag)
    push_tag_scope(parser, tag, ty);
  return ty;
}